

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O2

int __thiscall Program::getNextLineNumber(Program *this,int lineNumber)

{
  _Self __tmp;
  iterator iVar1;
  undefined1 *puVar2;
  Program *pPVar3;
  int local_c;
  
  local_c = lineNumber;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_Program::Line>,_std::_Select1st<std::pair<const_int,_Program::Line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Program::Line>_>_>
          ::find(&(this->list_of_program)._M_t,&local_c);
  puVar2 = (undefined1 *)std::_Rb_tree_increment(iVar1._M_node);
  pPVar3 = (Program *)(puVar2 + 0x20);
  if ((_Rb_tree_header *)puVar2 == &(this->list_of_program)._M_t._M_impl.super__Rb_tree_header) {
    pPVar3 = this;
  }
  return pPVar3->end_line;
}

Assistant:

int Program::getNextLineNumber(int lineNumber) {
    auto iter = list_of_program.find(lineNumber);
    iter++;
    if (iter == list_of_program.end()) return end_line;
    return iter->first;
}